

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall Liby::TimerQueue::handleTimeoutEvents(TimerQueue *this)

{
  bool bVar1;
  element_type *this_00;
  Logger *this_01;
  reference_type pWVar2;
  Timer *pTVar3;
  Timestamp *pTVar4;
  double __x;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  shared_ptr<Liby::Timer> TimerPtr;
  Timer *minTimer;
  WeakTimerHolder *weak_holder;
  Timestamp now;
  TimerQueue *this_local;
  
  now.tv_.tv_usec = (__suseconds_t)this;
  if (this->poller_ == (Poller *)0x0) {
    __assert_fail("poller_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TimerQueue.cpp"
                  ,0x53,"void Liby::TimerQueue::handleTimeoutEvents()");
  }
  bVar1 = BinaryHeap<Liby::WeakTimerHolder>::empty(&this->queue_);
  if (!bVar1) {
    Timestamp::now();
    while (bVar1 = BinaryHeap<Liby::WeakTimerHolder>::empty(&this->queue_),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      pWVar2 = BinaryHeap<Liby::WeakTimerHolder>::find_min(&this->queue_);
      pTVar3 = WeakTimerHolder::getTimer(pWVar2);
      pTVar4 = Timer::timeout(pTVar3);
      bVar1 = operator<((Timestamp *)&weak_holder,pTVar4);
      if (bVar1) break;
      WeakTimerHolder::getWeakTimerPtr
                ((WeakTimerHolder *)
                 &TimerPtr.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      bVar1 = std::__weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>::expired
                        ((__weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2> *)
                         &TimerPtr.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      std::weak_ptr<Liby::Timer>::~weak_ptr
                ((weak_ptr<Liby::Timer> *)
                 &TimerPtr.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        WeakTimerHolder::getWeakTimerPtr((WeakTimerHolder *)local_60);
        std::weak_ptr<Liby::Timer>::lock((weak_ptr<Liby::Timer> *)local_50);
        std::weak_ptr<Liby::Timer>::~weak_ptr((weak_ptr<Liby::Timer> *)local_60);
        this_00 = std::__shared_ptr_access<Liby::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Liby::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_50);
        Timer::runHandler(this_00);
        std::shared_ptr<Liby::Timer>::~shared_ptr((shared_ptr<Liby::Timer> *)local_50);
      }
      this_01 = Logger::getLogger();
      Timer::id(pTVar3);
      Logger::log(this_01,__x);
      BinaryHeap<Liby::WeakTimerHolder>::delete_min(&this->queue_);
    }
    bVar1 = BinaryHeap<Liby::WeakTimerHolder>::empty(&this->queue_);
    if (!bVar1) {
      pWVar2 = BinaryHeap<Liby::WeakTimerHolder>::find_min(&this->queue_);
      pTVar3 = WeakTimerHolder::getTimer(pWVar2);
      pTVar4 = Timer::timeout(pTVar3);
      updateTimerfd(this,pTVar4);
    }
  }
  return;
}

Assistant:

void TimerQueue::handleTimeoutEvents() {
    assert(poller_);
    if (queue_.empty()) {
        return;
    }

    auto now = Timestamp::now();
    while (!queue_.empty()) {
        WeakTimerHolder &weak_holder = queue_.find_min();
        Timer &minTimer = weak_holder.getTimer();
        if (now < minTimer.timeout()) {
            break;
        }

        if (!weak_holder.getWeakTimerPtr().expired()) {
            std::shared_ptr<Timer> TimerPtr =
                weak_holder.getWeakTimerPtr().lock();
            TimerPtr->runHandler();
        }
        verbose("delete timer id = %lu\n", minTimer.id());
        queue_.delete_min();
    }
    if (!queue_.empty()) {
        updateTimerfd(queue_.find_min().getTimer().timeout());
    }
}